

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_n_binary_ops_template.h
# Opt level: O2

bool __thiscall
test_uintwide_t_n_binary_ops_template<12288U,_unsigned_int,_void>::test_binary_mod
          (test_uintwide_t_n_binary_ops_template<12288U,_unsigned_int,_void> *this)

{
  anon_class_32_4_006e9c57 parallel_function;
  uint __sd;
  random_generator_type *this_00;
  bool result_is_ok;
  atomic_flag test_lock;
  uniform_int_distribution<int> dis;
  undefined1 local_42;
  atomic_flag local_41;
  undefined1 *local_40;
  test_uintwide_t_n_binary_ops_template<12288U,_unsigned_int,_void> *ptStack_38;
  undefined8 *local_30;
  atomic_flag *paStack_28;
  undefined8 local_20;
  
  local_41.super___atomic_flag_base._M_i = (__atomic_flag_base)false;
  this_00 = test_uintwide_t_n_binary_ops_base::my_gen();
  __sd = util::util_pseudorandom_time_point_seed::value<unsigned_int>();
  std::
  mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
  ::seed(this_00,__sd);
  local_30 = &local_20;
  local_20 = 0x2fff00000001;
  local_40 = &local_42;
  local_42 = 1;
  parallel_function.u_boost =
       (number<boost::multiprecision::backends::cpp_int_backend<24U,_24U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>
        **)this;
  parallel_function.u_local = (uintwide_t<24U,_unsigned_char,_void,_false> **)local_40;
  parallel_function.distribution = (distribution_type *)local_30;
  parallel_function.rnd_lock = &local_41;
  ptStack_38 = this;
  paStack_28 = &local_41;
  my_concurrency::
  parallel_for<unsigned_long,test_uintwide_t_n_binary_ops_template<12288u,unsigned_int,void>::test_binary_mod()const::_lambda(unsigned_long)_1_>
            (0,(this->super_test_uintwide_t_n_binary_ops_base).super_test_uintwide_t_n_base.
               number_of_cases,parallel_function);
  return (bool)local_42;
}

Assistant:

WIDE_INTEGER_NODISCARD auto test_binary_mod() const -> bool
    {
      std::atomic_flag test_lock = ATOMIC_FLAG_INIT;

      my_gen().seed(util::util_pseudorandom_time_point_seed::value<typename random_generator_type::result_type>());
      std::uniform_int_distribution<> dis(1, static_cast<int>(digits2 - 1U));

      bool result_is_ok = true;

      my_concurrency::parallel_for
      (
        static_cast<std::size_t>(0U),
        size(),
        [&result_is_ok, this, &dis, &test_lock](std::size_t i)
        {
          while(test_lock.test_and_set()) { ; }
          const auto right_shift_amount = static_cast<std::size_t>(dis(my_gen()));
          test_lock.clear();

          const boost_uint_type c_boost = a_boost[i] % (std::max)(boost_uint_type(1U), boost_uint_type(b_boost[i] >> right_shift_amount));
          const local_uint_type c_local = a_local[i] % (std::max)(local_uint_type(1U), (b_local[i] >> right_shift_amount));

          const std::string str_boost = hexlexical_cast(c_boost);
          const std::string str_local = hexlexical_cast(c_local);

          while(test_lock.test_and_set()) { ; }
          result_is_ok = ((str_boost == str_local) && result_is_ok);
          test_lock.clear();
        }
      );

      return result_is_ok;
    }